

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O3

void __thiscall
myvk::CommandBuffer::CmdCopy
          (CommandBuffer *this,Ptr<BufferBase> *src,Ptr<BufferBase> *dst,
          vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions)

{
  VkBufferCopy *pVVar1;
  
  pVVar1 = (regions->super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>)._M_impl.
           super__Vector_impl_data._M_start;
  (*vkCmdCopyBuffer)(this->m_command_buffer,
                     ((src->super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->m_buffer,
                     ((dst->super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     )->m_buffer,
                     (int)((ulong)((long)(regions->
                                         super__Vector_base<VkBufferCopy,_std::allocator<VkBufferCopy>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1)
                          >> 3) * -0x55555555,pVVar1);
  return;
}

Assistant:

void CommandBuffer::CmdCopy(const Ptr<BufferBase> &src, const Ptr<BufferBase> &dst,
                            const std::vector<VkBufferCopy> &regions) const {
	vkCmdCopyBuffer(m_command_buffer, src->GetHandle(), dst->GetHandle(), regions.size(), regions.data());
}